

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestXmlTestReporter.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_59db9::TestXmlTestReporterFixtureMultipleCharactersAreEscaped::
~TestXmlTestReporterFixtureMultipleCharactersAreEscaped
          (TestXmlTestReporterFixtureMultipleCharactersAreEscaped *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST_FIXTURE(XmlTestReporterFixture, MultipleCharactersAreEscaped)
{
    TestDetails const details("TestName", "suite", "filename.h", 4321);

    reporter.ReportTestStart(details);
    reporter.ReportFailure(details, "\"\"\'\'&&<<>>");
    reporter.ReportTestFinish(details, 0.1f);
    reporter.ReportSummary(1, 2, 3, 0.1f);

    char const* expected =
        "<?xml version=\"1.0\"?>"
        "<unittest-results tests=\"1\" failedtests=\"2\" failures=\"3\" time=\"0.1\">"
        "<test suite=\"suite\" name=\"TestName\" time=\"0.1\">"
        "<failure message=\"filename.h(4321) : "
        "&quot;&quot;&apos;&apos;&amp;&amp;&lt;&lt;&gt;&gt;\"/>"
        "</test>"
        "</unittest-results>";

    CHECK_EQUAL(expected, output.str());
}